

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlStringCurrentChar(xmlParserCtxtPtr ctxt,xmlChar *cur,int *len)

{
  int iVar1;
  
  if (len == (int *)0x0 || cur == (xmlChar *)0x0) {
    return 0;
  }
  *len = 4;
  iVar1 = xmlGetUTF8Char(cur,len);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlStringCurrentChar(xmlParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
                     const xmlChar *cur, int *len) {
    int c;

    if ((cur == NULL) || (len == NULL))
        return(0);

    /* cur is zero-terminated, so we can lie about its length. */
    *len = 4;
    c = xmlGetUTF8Char(cur, len);

    return((c < 0) ? 0 : c);
}